

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

bool ON_ClassId::PurgeAfter(ON_ClassId *pClassId)

{
  ON_ClassId *local_20;
  ON_ClassId *p;
  ON_ClassId *pClassId_local;
  
  local_20 = m_p0;
  while( true ) {
    if (local_20 == (ON_ClassId *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,0x28c,"","ON_ClassId::PurgeAfter pClassId is not active");
      return false;
    }
    if (pClassId == local_20) break;
    local_20 = local_20->m_pNext;
  }
  local_20->m_pNext = (ON_ClassId *)0x0;
  m_p1 = local_20;
  return true;
}

Assistant:

bool ON_ClassId::PurgeAfter(const ON_ClassId* pClassId)
{
  // If you crash in on the p=p->m_pNext iterator in
  // the for() loop, it is because somebody incorrectly
  // unloaded a dll that contains an ON_OBJECT_IMPLEMENT 
  // macro.
  for (ON_ClassId* p = m_p0; p; p = p->m_pNext)
  {
    if (pClassId == p)
    {
      // All class ids after pClassId are assumed to
      // be bad.
      p->m_pNext = 0;
      m_p1 = p;
      return true;
    }
  }

  ON_ERROR("ON_ClassId::PurgeAfter pClassId is not active");
  return false;
}